

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O1

Float __thiscall pbrt::TabulatedBSSRDF::SampleSr(TabulatedBSSRDF *this,Float u)

{
  float fVar1;
  BSSRDFTable *pBVar2;
  span<const_float> cdf;
  Float FVar3;
  span<const_float> nodes2;
  span<const_float> values;
  span<const_float> nodes1;
  
  fVar1 = (this->sigma_t).values.values[0];
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return -1.0;
  }
  pBVar2 = this->table;
  cdf.n = (pBVar2->profileCDF).nStored;
  cdf.ptr = (pBVar2->profileCDF).ptr;
  nodes2.n = (pBVar2->radiusSamples).nStored;
  nodes2.ptr = (pBVar2->radiusSamples).ptr;
  values.n = (pBVar2->profile).nStored;
  values.ptr = (pBVar2->profile).ptr;
  nodes1.n = (pBVar2->rhoSamples).nStored;
  nodes1.ptr = (pBVar2->rhoSamples).ptr;
  FVar3 = SampleCatmullRom2D(nodes1,nodes2,values,cdf,(this->rho).values.values[0],u,(Float *)0x0,
                             SUB168(ZEXT816(0),4));
  return FVar3 / (this->sigma_t).values.values[0];
}

Assistant:

PBRT_CPU_GPU
    Float SampleSr(Float u) const {
        if (sigma_t[0] == 0)
            return -1;
        return SampleCatmullRom2D(table->rhoSamples, table->radiusSamples, table->profile,
                                  table->profileCDF, rho[0], u) /
               sigma_t[0];
    }